

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filesystem.cc
# Opt level: O2

void __thiscall phosg::io_error::io_error(io_error *this,int fd)

{
  uint *puVar1;
  int error;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  string local_30;
  
  ::std::__cxx11::to_string(&local_30,fd);
  ::std::operator+(&local_90,"io error on fd ",&local_30);
  ::std::operator+(&local_70,&local_90,": ");
  puVar1 = (uint *)__errno_location();
  string_for_error_abi_cxx11_(&local_b0,(phosg *)(ulong)*puVar1,error);
  ::std::operator+(&local_50,&local_70,&local_b0);
  ::std::runtime_error::runtime_error((runtime_error *)&this->field_0x10,(string *)&local_50);
  ::std::__cxx11::string::~string((string *)&local_50);
  ::std::__cxx11::string::~string((string *)&local_b0);
  ::std::__cxx11::string::~string((string *)&local_70);
  ::std::__cxx11::string::~string((string *)&local_90);
  ::std::__cxx11::string::~string((string *)&local_30);
  this->_vptr_io_error = (_func_int **)0x145b90;
  *(undefined8 *)&this->field_0x10 = 0x145bc0;
  this->error = *puVar1;
  return;
}

Assistant:

io_error::io_error(int fd)
    : runtime_error("io error on fd " + to_string(fd) + ": " + string_for_error(errno)),
      error(errno) {}